

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3ResultSetOfSelect(Parse *pParse,Select *pSelect)

{
  uint uVar1;
  sqlite3 *db;
  Table *pTable;
  Select *pSelect_00;
  
  db = pParse->db;
  uVar1 = db->flags;
  db->flags = uVar1 & 0xfffffff3 | 8;
  sqlite3SelectPrep(pParse,pSelect,(NameContext *)0x0);
  if (pParse->nErr == 0) {
    do {
      pSelect_00 = pSelect;
      pSelect = pSelect_00->pPrior;
    } while (pSelect_00->pPrior != (Select *)0x0);
    db->flags = uVar1;
    pTable = (Table *)sqlite3DbMallocRaw(db,0x78);
    if (pTable != (Table *)0x0) {
      pTable->iPKey = 0;
      pTable->nCol = 0;
      pTable->nRef = 0;
      pTable->tabFlags = '\0';
      pTable->keyConf = '\0';
      pTable->addColOffset = 0;
      pTable->nModuleArg = 0;
      pTable->zName = (char *)0x0;
      pTable->aCol = (Column *)0x0;
      pTable->pCheck = (ExprList *)0x0;
      pTable->nRowEst = 0;
      pTable->tnum = 0;
      pTable->pTrigger = (Trigger *)0x0;
      pTable->pSchema = (Schema *)0x0;
      pTable->azModuleArg = (char **)0x0;
      pTable->pVTable = (VTable *)0x0;
      pTable->pFKey = (FKey *)0x0;
      pTable->zColAff = (char *)0x0;
      pTable->pIndex = (Index *)0x0;
      pTable->pSelect = (Select *)0x0;
      pTable->pNextZombie = (Table *)0x0;
      pTable->nRef = 1;
      pTable->zName = (char *)0x0;
      pTable->nRowEst = 1000000;
      selectColumnsFromExprList(pParse,pSelect_00->pEList,&pTable->nCol,&pTable->aCol);
      selectAddColumnTypeAndCollation(pParse,(int)pTable->nCol,pTable->aCol,pSelect_00);
      pTable->iPKey = -1;
      if (db->mallocFailed == '\0') {
        return pTable;
      }
      sqlite3DeleteTable(db,pTable);
    }
  }
  return (Table *)0x0;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3ResultSetOfSelect(Parse *pParse, Select *pSelect){
  Table *pTab;
  sqlite3 *db = pParse->db;
  int savedFlags;

  savedFlags = db->flags;
  db->flags &= ~SQLITE_FullColNames;
  db->flags |= SQLITE_ShortColNames;
  sqlite3SelectPrep(pParse, pSelect, 0);
  if( pParse->nErr ) return 0;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  db->flags = savedFlags;
  pTab = sqlite3DbMallocZero(db, sizeof(Table) );
  if( pTab==0 ){
    return 0;
  }
  /* The sqlite3ResultSetOfSelect() is only used n contexts where lookaside
  ** is disabled */
  assert( db->lookaside.bEnabled==0 );
  pTab->nRef = 1;
  pTab->zName = 0;
  pTab->nRowEst = 1000000;
  selectColumnsFromExprList(pParse, pSelect->pEList, &pTab->nCol, &pTab->aCol);
  selectAddColumnTypeAndCollation(pParse, pTab->nCol, pTab->aCol, pSelect);
  pTab->iPKey = -1;
  if( db->mallocFailed ){
    sqlite3DeleteTable(db, pTab);
    return 0;
  }
  return pTab;
}